

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O2

int coda_mem_cursor_get_num_elements(coda_cursor *cursor,long *num_elements)

{
  coda_dynamic_type_struct *pcVar1;
  int iVar2;
  char *pcVar3;
  coda_type *pcVar4;
  long lVar5;
  ulong uVar6;
  char *pcStack_50;
  char acStack_48 [24];
  
  pcVar1 = cursor->stack[(long)cursor->n + -1].type;
  switch(pcVar1[1].backend) {
  case coda_backend_ascii:
  case coda_backend_binary:
    *num_elements = *(long *)(pcVar1 + 2);
    break;
  case 2:
    if (pcVar1->definition->format != coda_format_ascii) {
      iVar2 = coda_bin_cursor_get_num_elements(cursor,num_elements);
      return iVar2;
    }
    pcVar4 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
    if (99 < pcVar4->format) {
      pcVar4 = *(coda_type **)&pcVar4->type_class;
    }
    if (1 < pcVar4->type_class) {
      *num_elements = 1;
      return 0;
    }
    pcVar4 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
    if (99 < pcVar4->format) {
      pcVar4 = *(coda_type **)&pcVar4->type_class;
    }
    if (pcVar4->type_class == 1) {
      pcVar3 = *(char **)&pcVar4[1].type_class;
      if (pcVar3 == (char *)0xffffffffffffffff) {
        lVar5 = 1;
        uVar6 = 0;
        do {
          if ((long)*(int *)&pcVar4[1].name <= (long)uVar6) {
            *num_elements = lVar5;
            return 0;
          }
          pcVar3 = (&pcVar4[1].description)[uVar6];
          if ((&pcVar4[1].description)[uVar6] == (char *)0xffffffffffffffff) {
            iVar2 = coda_expression_eval_integer
                              ((coda_expression *)(&pcVar4[2].bit_size)[uVar6],cursor,
                               (int64_t *)&pcStack_50);
            if (iVar2 != 0) {
              coda_add_error_message(" for dim[%d] expression",uVar6 & 0xffffffff);
LAB_00119cf1:
              coda_cursor_add_to_error_message(cursor);
              return -1;
            }
            pcVar3 = pcStack_50;
            if ((long)pcStack_50 < 0) {
              coda_str64((int64_t)pcStack_50,acStack_48);
              coda_set_error(-300,
                             "product error detected (invalid array size - calculated array size = %s)"
                             ,acStack_48);
              goto LAB_00119cf1;
            }
          }
          lVar5 = lVar5 * (long)pcVar3;
          uVar6 = uVar6 + 1;
        } while( true );
      }
    }
    else {
      if (pcVar4->type_class != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascbin-cursor.c"
                      ,0x343,"int coda_ascbin_cursor_get_num_elements(const coda_cursor *, long *)")
        ;
      }
      pcVar3 = pcVar4[1].name;
    }
    *num_elements = (long)pcVar3;
    return 0;
  case 3:
    *num_elements = 1;
  }
  return 0;
}

Assistant:

int coda_mem_cursor_get_num_elements(const coda_cursor *cursor, long *num_elements)
{
    coda_mem_type *type = (coda_mem_type *)cursor->stack[cursor->n - 1].type;

    switch (type->tag)
    {
        case tag_mem_record:
            *num_elements = ((coda_mem_record *)cursor->stack[cursor->n - 1].type)->num_fields;
            break;
        case tag_mem_array:
            *num_elements = ((coda_mem_array *)cursor->stack[cursor->n - 1].type)->num_elements;
            break;
        case tag_mem_data:
            if (type->definition->format == coda_format_ascii)
            {
                return coda_ascii_cursor_get_num_elements(cursor, num_elements);
            }
            return coda_bin_cursor_get_num_elements(cursor, num_elements);
        case tag_mem_special:
            *num_elements = 1;
            break;
    }
    return 0;
}